

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract
               (defV *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  pointer *ppcVar1;
  iterator __position;
  pointer pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args_00;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar8;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x;
  uint *puVar9;
  pointer pdVar10;
  pointer pdVar11;
  ulong uVar12;
  long lVar13;
  string_view val_00;
  string_view val_01;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  double local_28;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,0);
  puVar9 = &switchD_001f8317::switchdataD_004311b4;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    __args = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    goto LAB_001f8481;
  case '\x01':
    pvVar7 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(double)*pvVar7;
    local_28 = 0.0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
               (double *)&local_48,&local_28);
    break;
  default:
    pvVar6 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_01._M_str = (pvVar6->_M_dataplus)._M_p;
    val_01._M_len = pvVar6->_M_string_length;
    helicsGetComplexVector(val_01,val);
    return;
  case '\x03':
    __args_00 = std::
                get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    __position._M_current =
         (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      _M_realloc_insert<std::complex<double>const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,__position
                 ,__args_00);
      return;
    }
    uVar4 = *(undefined8 *)(__args_00->_M_value + 8);
    *(undefined8 *)(__position._M_current)->_M_value = *(undefined8 *)__args_00->_M_value;
    *(undefined8 *)((__position._M_current)->_M_value + 8) = uVar4;
    ppcVar1 = &(val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
    break;
  case '\x04':
    pvVar8 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (val,(long)(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
    pcVar2 = (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    if ((val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
      (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = pcVar2;
    }
    pdVar10 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pdVar11 - (long)pdVar10 != 8) {
      lVar13 = 8;
      uVar12 = 0;
      do {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                   (double *)((long)pdVar10 + lVar13 + -8),(double *)((long)pdVar10 + lVar13));
        uVar12 = uVar12 + 2;
        pdVar10 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar13 = lVar13 + 0x10;
      } while (uVar12 < ((long)pdVar11 - (long)pdVar10 >> 3) - 1U);
      if (((long)pdVar11 - (long)pdVar10 & 8U) == 0) {
        return;
      }
    }
    __args = pdVar11 + -1;
LAB_001f8481:
    local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double_const&,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,__args,
               (double *)&local_48);
    break;
  case '\x05':
    __x = std::
          get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(val,__x);
    return;
  case '\x06':
    pvVar5 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (NAN(pvVar5->value)) {
      val_00._M_str = (char *)puVar9;
      val_00._M_len = (size_t)(pvVar5->name)._M_dataplus._M_p;
      helicsGetComplexVector(&local_48,(helics *)(pvVar5->name)._M_string_length,val_00);
      pcVar2 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
      _M_impl.super__Vector_impl_data._M_start =
           local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (val->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pcVar2 != (pointer)0x0) &&
         (operator_delete(pcVar2,(long)pcVar3 - (long)pcVar2),
         local_48.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_48.
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,1);
      pcVar2 = (val->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(double *)pcVar2->_M_value = pvVar5->value;
      *(undefined8 *)(pcVar2->_M_value + 8) = 0;
    }
  }
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.emplace_back(std::get<double>(data), 0.0);
            break;
        case int_loc:  // int64_t
            val.emplace_back(static_cast<double>(std::get<int64_t>(data)), 0.0);
            break;
        case string_loc:  // string
        default:
            helicsGetComplexVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            val.push_back(std::get<std::complex<double>>(data));
        } break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val.reserve(vec.size() + 1 / 2);
            val.clear();
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }
            break;
        }
        case complex_vector_loc:  // complex
            val = std::get<std::vector<std::complex<double>>>(data);
            break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetComplexVector(point.name);
            } else {
                val.resize(1);
                val[0] = std::complex<double>(point.value, 0.0);
            }
            break;
        }
    }
}